

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::GeometryProgramQueryCase::init
          (GeometryProgramQueryCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  ContextType ctxType;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  NotSupportedError *this_00;
  int iVar2;
  
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_EXT_geometry_shader");
  iVar2 = (int)CONCAT71(extraout_var,bVar1);
  if (!bVar1) {
    ctxType.super_ApiType.m_bits =
         (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
    iVar2 = (int)CONCAT71(extraout_var_00,bVar1);
    if (!bVar1) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"Tests require GL_EXT_geometry_shader extension or higher context version."
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                 ,0xf6f);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  return iVar2;
}

Assistant:

void GeometryProgramQueryCase::init (void)
{
	if (!(m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader") || glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2))))
		TCU_THROW(NotSupportedError, "Tests require GL_EXT_geometry_shader extension or higher context version.");
}